

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O1

Status __thiscall leveldb::DBTest::TryReopen(DBTest *this,Options *options)

{
  long lVar1;
  undefined8 *in_RDX;
  Options *pOVar2;
  Options *pOVar3;
  Cache **ppCVar4;
  byte bVar5;
  Options opts;
  Options local_e0;
  Options local_80;
  
  bVar5 = 0;
  if (*(long **)&options->max_open_files != (long *)0x0) {
    (**(code **)(**(long **)&options->max_open_files + 8))();
  }
  *(undefined8 *)&options->max_open_files = 0;
  Options::Options(&local_e0);
  if (in_RDX == (undefined8 *)0x0) {
    CurrentOptions(&local_80,(DBTest *)options);
    pOVar2 = &local_80;
    pOVar3 = &local_e0;
    for (lVar1 = 0xc; lVar1 != 0; lVar1 = lVar1 + -1) {
      pOVar3->comparator = pOVar2->comparator;
      pOVar2 = (Options *)((long)pOVar2 + (ulong)bVar5 * -0x10 + 8);
      pOVar3 = (Options *)((long)pOVar3 + ((ulong)bVar5 * -2 + 1) * 8);
    }
    local_e0.create_if_missing = true;
  }
  else {
    pOVar2 = &local_e0;
    for (lVar1 = 0xc; lVar1 != 0; lVar1 = lVar1 + -1) {
      pOVar2->comparator = (Comparator *)*in_RDX;
      in_RDX = in_RDX + (ulong)bVar5 * -2 + 1;
      pOVar2 = (Options *)((long)pOVar2 + ((ulong)bVar5 * -2 + 1) * 8);
    }
  }
  pOVar2 = &local_e0;
  ppCVar4 = &options->block_cache;
  for (lVar1 = 0xc; lVar1 != 0; lVar1 = lVar1 + -1) {
    *ppCVar4 = (Cache *)pOVar2->comparator;
    pOVar2 = (Options *)((long)pOVar2 + (ulong)bVar5 * -0x10 + 8);
    ppCVar4 = ppCVar4 + (ulong)bVar5 * -2 + 1;
  }
  DB::Open((DB *)this,&local_e0,(string *)options,(DB **)&options->max_open_files);
  return (Status)(char *)this;
}

Assistant:

Status TryReopen(Options* options) {
    delete db_;
    db_ = nullptr;
    Options opts;
    if (options != nullptr) {
      opts = *options;
    } else {
      opts = CurrentOptions();
      opts.create_if_missing = true;
    }
    last_options_ = opts;

    return DB::Open(opts, dbname_, &db_);
  }